

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O2

void __thiscall YAML::Emitter::BlockMapPrepareSimpleKey(Emitter *this,value child)

{
  _Head_base<0UL,_YAML::EmitterState_*,_false> _Var1;
  size_t indent;
  size_t sVar2;
  
  _Var1._M_head_impl =
       (this->m_pState)._M_t.
       super___uniq_ptr_impl<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>._M_t.
       super__Tuple_impl<0UL,_YAML::EmitterState_*,_std::default_delete<YAML::EmitterState>_>.
       super__Head_base<0UL,_YAML::EmitterState_*,_false>._M_head_impl;
  indent = (_Var1._M_head_impl)->m_curIndent;
  sVar2 = EmitterState::CurGroupChildCount(_Var1._M_head_impl);
  if (child != NoType) {
    _Var1._M_head_impl =
         (this->m_pState)._M_t.
         super___uniq_ptr_impl<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>._M_t.
         super__Tuple_impl<0UL,_YAML::EmitterState_*,_std::default_delete<YAML::EmitterState>_>.
         super__Head_base<0UL,_YAML::EmitterState_*,_false>._M_head_impl;
    if (((((_Var1._M_head_impl)->m_hasAnchor == false) && ((_Var1._M_head_impl)->m_hasTag == false))
        && (sVar2 != 0)) && ((_Var1._M_head_impl)->m_hasNonContent == false)) {
      YAML::operator<<(&this->m_stream,(char (*) [2])0x6ecc3e);
    }
    if ((child < BlockMap) && ((0x2eU >> (child & 0x1f) & 1) != 0)) {
      _Var1._M_head_impl =
           (this->m_pState)._M_t.
           super___uniq_ptr_impl<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>._M_t.
           super__Tuple_impl<0UL,_YAML::EmitterState_*,_std::default_delete<YAML::EmitterState>_>.
           super__Head_base<0UL,_YAML::EmitterState_*,_false>._M_head_impl;
      SpaceOrIndentTo(this,(bool)(((_Var1._M_head_impl)->m_hasTag |
                                  (_Var1._M_head_impl)->m_hasAnchor) & 1),indent);
      return;
    }
  }
  return;
}

Assistant:

void Emitter::BlockMapPrepareSimpleKey(EmitterNodeType::value child) {
  const std::size_t curIndent = m_pState->CurIndent();
  const std::size_t childCount = m_pState->CurGroupChildCount();

  if (child == EmitterNodeType::NoType)
    return;

  if (!m_pState->HasBegunNode()) {
    if (childCount > 0) {
      m_stream << "\n";
    }
  }

  switch (child) {
    case EmitterNodeType::NoType:
      break;
    case EmitterNodeType::Property:
    case EmitterNodeType::Scalar:
    case EmitterNodeType::FlowSeq:
    case EmitterNodeType::FlowMap:
      SpaceOrIndentTo(m_pState->HasBegunContent(), curIndent);
      break;
    case EmitterNodeType::BlockSeq:
    case EmitterNodeType::BlockMap:
      break;
  }
}